

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O2

void __thiscall
duckdb::AggregateExecutor::
UnaryScatter<duckdb::SumState<duckdb::hugeint_t>,duckdb::hugeint_t,duckdb::HugeintSumOperation>
          (AggregateExecutor *this,Vector *input,Vector *states,AggregateInputData *aggr_input_data,
          idx_t count)

{
  hugeint_t *idata;
  SumState<duckdb::hugeint_t> **states_00;
  UnifiedVectorFormat sdata;
  AggregateUnaryInput input_data;
  UnifiedVectorFormat local_b8;
  UnifiedVectorFormat local_70;
  
  if (*this == (AggregateExecutor)0x0) {
    if (input->vector_type == FLAT_VECTOR) {
      idata = *(hugeint_t **)(this + 0x20);
      states_00 = (SumState<duckdb::hugeint_t> **)input->data;
      FlatVector::VerifyFlatVector((Vector *)this);
      UnaryFlatLoop<duckdb::SumState<duckdb::hugeint_t>,duckdb::hugeint_t,duckdb::HugeintSumOperation>
                (idata,(AggregateInputData *)states,states_00,(ValidityMask *)(this + 0x28),
                 (idx_t)aggr_input_data);
      return;
    }
  }
  else if ((*this == (AggregateExecutor)0x2) && (input->vector_type == CONSTANT_VECTOR)) {
    if ((*(byte **)(this + 0x28) != (byte *)0x0) && ((**(byte **)(this + 0x28) & 1) == 0)) {
      return;
    }
    local_70.data = (data_ptr_t)(this + 0x28);
    local_70.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
         (unsigned_long *)0x0;
    local_70.sel = (SelectionVector *)states;
    BaseSumOperation<duckdb::SumSetOperation,duckdb::HugeintAdd>::
    ConstantOperation<duckdb::hugeint_t,duckdb::SumState<duckdb::hugeint_t>,duckdb::HugeintSumOperation>
              (*(BaseSumOperation<duckdb::SumSetOperation,duckdb::HugeintAdd> **)input->data,
               *(SumState<duckdb::hugeint_t> **)(this + 0x20),(hugeint_t *)&local_70,
               (AggregateUnaryInput *)aggr_input_data,count);
    return;
  }
  UnifiedVectorFormat::UnifiedVectorFormat(&local_70);
  UnifiedVectorFormat::UnifiedVectorFormat(&local_b8);
  Vector::ToUnifiedFormat((Vector *)this,(idx_t)aggr_input_data,&local_70);
  Vector::ToUnifiedFormat(input,(idx_t)aggr_input_data,&local_b8);
  UnaryScatterLoop<duckdb::SumState<duckdb::hugeint_t>,duckdb::hugeint_t,duckdb::HugeintSumOperation>
            ((hugeint_t *)local_70.data,(AggregateInputData *)states,
             (SumState<duckdb::hugeint_t> **)local_b8.data,local_70.sel,local_b8.sel,
             &local_70.validity,(idx_t)aggr_input_data);
  UnifiedVectorFormat::~UnifiedVectorFormat(&local_b8);
  UnifiedVectorFormat::~UnifiedVectorFormat(&local_70);
  return;
}

Assistant:

static void UnaryScatter(Vector &input, Vector &states, AggregateInputData &aggr_input_data, idx_t count) {
		if (input.GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    states.GetVectorType() == VectorType::CONSTANT_VECTOR) {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				// constant NULL input in function that ignores NULL values
				return;
			}
			// regular constant: get first state
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			auto sdata = ConstantVector::GetData<STATE_TYPE *>(states);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(**sdata, *idata, input_data, count);
#ifndef DUCKDB_SMALLER_BINARY
		} else if (input.GetVectorType() == VectorType::FLAT_VECTOR &&
		           states.GetVectorType() == VectorType::FLAT_VECTOR) {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			auto sdata = FlatVector::GetData<STATE_TYPE *>(states);
			UnaryFlatLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, sdata, FlatVector::Validity(input),
			                                          count);
#endif
		} else {
			UnifiedVectorFormat idata, sdata;
			input.ToUnifiedFormat(count, idata);
			states.ToUnifiedFormat(count, sdata);
			UnaryScatterLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                             aggr_input_data, (STATE_TYPE **)sdata.data, *idata.sel,
			                                             *sdata.sel, idata.validity, count);
		}
	}